

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spherei_intersector.h
# Opt level: O3

void embree::avx2::SphereMiIntersector1<8,_true>::intersect
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *sphere)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint uVar25;
  uint uVar26;
  uint uVar27;
  Scene *pSVar28;
  ulong uVar29;
  undefined4 uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [36];
  undefined1 auVar48 [36];
  undefined1 auVar49 [36];
  undefined1 auVar50 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar57 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [28];
  undefined1 auVar61 [64];
  undefined1 auVar62 [28];
  undefined1 auVar64 [64];
  undefined1 auVar65 [28];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [28];
  undefined1 auVar70 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  SphereIntersectorHitM<8> hit;
  int local_2e8;
  float local_2e4;
  RTCFilterFunctionNArguments local_2e0;
  float local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a4;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  undefined1 local_280 [32];
  Scene *local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  uint local_a0 [4];
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  undefined1 local_80 [32];
  undefined1 auVar53 [64];
  undefined1 auVar56 [64];
  undefined1 auVar60 [32];
  undefined1 auVar63 [32];
  
  pSVar28 = context->scene;
  local_a0[0] = sphere->sharedGeomID;
  pGVar6 = (pSVar28->geometries).items[local_a0[0]].ptr;
  lVar7 = *(long *)&pGVar6->field_0x58;
  _Var8 = pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar32._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[4] * _Var8);
  auVar32._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[0] * _Var8);
  auVar38._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[5] * _Var8);
  auVar38._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[1] * _Var8);
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[6] * _Var8);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[2] * _Var8);
  auVar44._16_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[7] * _Var8);
  auVar44._0_16_ = *(undefined1 (*) [16])(lVar7 + (sphere->primIDs).field_0.i[3] * _Var8);
  auVar42 = vunpcklps_avx(auVar32,auVar40);
  auVar35 = vunpckhps_avx(auVar32,auVar40);
  auVar43 = vunpcklps_avx(auVar38,auVar44);
  auVar32 = vunpckhps_avx(auVar38,auVar44);
  auVar18 = vunpcklps_avx(auVar42,auVar43);
  auVar42 = vunpckhps_avx(auVar42,auVar43);
  auVar43 = vunpcklps_avx(auVar35,auVar32);
  auVar38 = vunpckhps_avx(auVar35,auVar32);
  bVar5 = sphere->numPrimitives;
  auVar33._1_3_ = 0;
  auVar33[0] = bVar5;
  auVar33[4] = bVar5;
  auVar33._5_3_ = 0;
  auVar33[8] = bVar5;
  auVar33._9_3_ = 0;
  auVar33[0xc] = bVar5;
  auVar33._13_3_ = 0;
  auVar33[0x10] = bVar5;
  auVar33._17_3_ = 0;
  auVar33[0x14] = bVar5;
  auVar33._21_3_ = 0;
  auVar33[0x18] = bVar5;
  auVar33._25_3_ = 0;
  auVar33[0x1c] = bVar5;
  auVar33._29_3_ = 0;
  auVar33 = vpcmpgtd_avx2(auVar33,_DAT_01fe9900);
  local_a0[1] = local_a0[0];
  local_a0[2] = local_a0[0];
  local_a0[3] = local_a0[0];
  uStack_90 = local_a0[0];
  uStack_8c = local_a0[0];
  uStack_88 = local_a0[0];
  uStack_84 = local_a0[0];
  auVar31 = vpalignr_avx(*(undefined1 (*) [16])((long)&(ray->super_RayK<1>).dir.field_0 + 8),
                         *(undefined1 (*) [16])((long)&(ray->super_RayK<1>).org.field_0 + 8),8);
  auVar31 = vdpps_avx(auVar31,auVar31,0x7f);
  auVar17 = vrcpss_avx(auVar31,auVar31);
  auVar31 = vfnmadd213ss_fma(auVar31,auVar17,ZEXT416(0x40000000));
  fVar16 = auVar17._0_4_ * auVar31._0_4_;
  uVar30 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  auVar51._4_4_ = uVar30;
  auVar51._0_4_ = uVar30;
  auVar51._8_4_ = uVar30;
  auVar51._12_4_ = uVar30;
  auVar51._16_4_ = uVar30;
  auVar51._20_4_ = uVar30;
  auVar51._24_4_ = uVar30;
  auVar51._28_4_ = uVar30;
  auVar35 = vsubps_avx(auVar18,auVar51);
  uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  auVar45._4_4_ = uVar30;
  auVar45._0_4_ = uVar30;
  auVar45._8_4_ = uVar30;
  auVar45._12_4_ = uVar30;
  auVar45._16_4_ = uVar30;
  auVar45._20_4_ = uVar30;
  auVar45._24_4_ = uVar30;
  auVar45._28_4_ = uVar30;
  uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar54._16_4_ = uVar1;
  auVar54._20_4_ = uVar1;
  auVar54._24_4_ = uVar1;
  auVar54._28_4_ = uVar1;
  auVar32 = vsubps_avx(auVar42,auVar45);
  auVar42 = vsubps_avx(auVar43,auVar54);
  fVar2 = (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar60._4_4_ = fVar2;
  auVar60._0_4_ = fVar2;
  auVar60._8_4_ = fVar2;
  auVar60._12_4_ = fVar2;
  auVar60._16_4_ = fVar2;
  auVar60._20_4_ = fVar2;
  auVar60._24_4_ = fVar2;
  auVar60._28_4_ = fVar2;
  auVar61 = ZEXT3264(auVar60);
  fVar3 = (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar63._4_4_ = fVar3;
  auVar63._0_4_ = fVar3;
  auVar63._8_4_ = fVar3;
  auVar63._12_4_ = fVar3;
  auVar63._16_4_ = fVar3;
  auVar63._20_4_ = fVar3;
  auVar63._24_4_ = fVar3;
  auVar63._28_4_ = fVar3;
  auVar64 = ZEXT3264(auVar63);
  fVar4 = (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar66 = ZEXT3264(CONCAT428(fVar4,CONCAT424(fVar4,CONCAT420(fVar4,CONCAT416(fVar4,CONCAT412(fVar4
                                                  ,CONCAT48(fVar4,CONCAT44(fVar4,fVar4))))))));
  auVar43._4_4_ = fVar4 * auVar42._4_4_;
  auVar43._0_4_ = fVar4 * auVar42._0_4_;
  auVar43._8_4_ = fVar4 * auVar42._8_4_;
  auVar43._12_4_ = fVar4 * auVar42._12_4_;
  auVar43._16_4_ = fVar4 * auVar42._16_4_;
  auVar43._20_4_ = fVar4 * auVar42._20_4_;
  auVar43._24_4_ = fVar4 * auVar42._24_4_;
  auVar43._28_4_ = uVar30;
  auVar31 = vfmadd231ps_fma(auVar43,auVar32,auVar63);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar35,auVar60);
  auVar46._0_4_ = fVar16 * auVar31._0_4_;
  auVar46._4_4_ = fVar16 * auVar31._4_4_;
  auVar46._8_4_ = fVar16 * auVar31._8_4_;
  auVar46._12_4_ = fVar16 * auVar31._12_4_;
  auVar46._16_4_ = fVar16 * 0.0;
  auVar46._20_4_ = fVar16 * 0.0;
  auVar46._24_4_ = fVar16 * 0.0;
  auVar46._28_4_ = 0;
  auVar18._4_4_ = fVar2 * auVar46._4_4_;
  auVar18._0_4_ = fVar2 * auVar46._0_4_;
  auVar18._8_4_ = fVar2 * auVar46._8_4_;
  auVar18._12_4_ = fVar2 * auVar46._12_4_;
  auVar18._16_4_ = fVar2 * auVar46._16_4_;
  auVar18._20_4_ = fVar2 * auVar46._20_4_;
  auVar18._24_4_ = fVar2 * auVar46._24_4_;
  auVar18._28_4_ = uVar1;
  auVar58._0_4_ = fVar3 * auVar46._0_4_;
  auVar58._4_4_ = fVar3 * auVar46._4_4_;
  auVar58._8_4_ = fVar3 * auVar46._8_4_;
  auVar58._12_4_ = fVar3 * auVar46._12_4_;
  auVar58._16_4_ = fVar3 * auVar46._16_4_;
  auVar58._20_4_ = fVar3 * auVar46._20_4_;
  auVar58._28_36_ = in_ZMM8._28_36_;
  auVar58._24_4_ = fVar3 * auVar46._24_4_;
  auVar53._0_4_ = fVar4 * auVar46._0_4_;
  auVar53._4_4_ = fVar4 * auVar46._4_4_;
  auVar53._8_4_ = fVar4 * auVar46._8_4_;
  auVar53._12_4_ = fVar4 * auVar46._12_4_;
  auVar53._16_4_ = fVar4 * auVar46._16_4_;
  auVar53._20_4_ = fVar4 * auVar46._20_4_;
  auVar53._28_36_ = in_ZMM9._28_36_;
  auVar53._24_4_ = fVar4 * auVar46._24_4_;
  auVar43 = vsubps_avx(auVar35,auVar18);
  auVar67 = ZEXT3264(auVar43);
  auVar18 = vsubps_avx(auVar32,auVar58._0_32_);
  auVar68 = ZEXT3264(auVar18);
  auVar42 = vsubps_avx(auVar42,auVar53._0_32_);
  auVar58 = ZEXT3264(auVar42);
  auVar35._4_4_ = auVar42._4_4_ * auVar42._4_4_;
  auVar35._0_4_ = auVar42._0_4_ * auVar42._0_4_;
  auVar35._8_4_ = auVar42._8_4_ * auVar42._8_4_;
  auVar35._12_4_ = auVar42._12_4_ * auVar42._12_4_;
  auVar35._16_4_ = auVar42._16_4_ * auVar42._16_4_;
  auVar35._20_4_ = auVar42._20_4_ * auVar42._20_4_;
  auVar35._24_4_ = auVar42._24_4_ * auVar42._24_4_;
  auVar35._28_4_ = auVar32._28_4_;
  auVar31 = vfmadd231ps_fma(auVar35,auVar18,auVar18);
  auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar43,auVar43);
  auVar19._4_4_ = auVar38._4_4_ * auVar38._4_4_;
  auVar19._0_4_ = auVar38._0_4_ * auVar38._0_4_;
  auVar19._8_4_ = auVar38._8_4_ * auVar38._8_4_;
  auVar19._12_4_ = auVar38._12_4_ * auVar38._12_4_;
  auVar19._16_4_ = auVar38._16_4_ * auVar38._16_4_;
  auVar19._20_4_ = auVar38._20_4_ * auVar38._20_4_;
  auVar19._24_4_ = auVar38._24_4_ * auVar38._24_4_;
  auVar19._28_4_ = auVar38._28_4_;
  auVar35 = vcmpps_avx(ZEXT1632(auVar31),auVar19,2);
  auVar32 = auVar33 & auVar35;
  if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar32 >> 0x7f,0) != '\0') ||
        (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar32 >> 0xbf,0) != '\0') ||
      (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar32[0x1f] < '\0') {
    auVar35 = vandps_avx(auVar35,auVar33);
    auVar17 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
    auVar35 = vsubps_avx(auVar19,ZEXT1632(auVar31));
    auVar20._4_4_ = fVar16 * auVar35._4_4_;
    auVar20._0_4_ = fVar16 * auVar35._0_4_;
    auVar20._8_4_ = fVar16 * auVar35._8_4_;
    auVar20._12_4_ = fVar16 * auVar35._12_4_;
    auVar20._16_4_ = fVar16 * auVar35._16_4_;
    auVar20._20_4_ = fVar16 * auVar35._20_4_;
    auVar20._24_4_ = fVar16 * auVar35._24_4_;
    auVar20._28_4_ = auVar35._28_4_;
    auVar38 = vsqrtps_avx(auVar20);
    auVar70 = ZEXT3264(auVar38);
    auVar33 = vsubps_avx(auVar46,auVar38);
    auVar52._0_4_ = auVar38._0_4_ + auVar46._0_4_;
    auVar52._4_4_ = auVar38._4_4_ + auVar46._4_4_;
    auVar52._8_4_ = auVar38._8_4_ + auVar46._8_4_;
    auVar52._12_4_ = auVar38._12_4_ + auVar46._12_4_;
    auVar52._16_4_ = auVar38._16_4_ + auVar46._16_4_;
    auVar52._20_4_ = auVar38._20_4_ + auVar46._20_4_;
    auVar52._24_4_ = auVar38._24_4_ + auVar46._24_4_;
    auVar52._28_4_ = auVar38._28_4_ + 0.0;
    auVar53 = ZEXT3264(auVar52);
    uVar30 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    auVar39._4_4_ = uVar30;
    auVar39._0_4_ = uVar30;
    auVar39._8_4_ = uVar30;
    auVar39._12_4_ = uVar30;
    auVar39._16_4_ = uVar30;
    auVar39._20_4_ = uVar30;
    auVar39._24_4_ = uVar30;
    auVar39._28_4_ = uVar30;
    auVar35 = vcmpps_avx(auVar39,auVar33,2);
    fVar16 = (ray->super_RayK<1>).tfar;
    auVar24._4_4_ = fVar16;
    auVar24._0_4_ = fVar16;
    auVar24._8_4_ = fVar16;
    auVar24._12_4_ = fVar16;
    auVar24._16_4_ = fVar16;
    auVar24._20_4_ = fVar16;
    auVar24._24_4_ = fVar16;
    auVar24._28_4_ = fVar16;
    auVar32 = vcmpps_avx(auVar33,auVar24,2);
    auVar35 = vandps_avx(auVar35,auVar32);
    auVar31 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
    local_250 = vpand_avx(auVar31,auVar17);
    auVar35 = vcmpps_avx(auVar39,auVar52,2);
    auVar32 = vcmpps_avx(auVar52,auVar24,2);
    auVar35 = vandps_avx(auVar35,auVar32);
    auVar31 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
    local_190 = vpand_avx(auVar31,auVar17);
    auVar31 = vpor_avx(local_250,local_190);
    auVar35 = vpmovsxwd_avx2(auVar31);
    if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0x7f,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar35 >> 0xbf,0) != '\0') ||
        (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar35[0x1f] < '\0')
    {
      auVar32 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
      auVar37 = ZEXT3264(auVar32);
      auVar19 = vpmovsxwd_avx2(local_250);
      local_240 = vblendvps_avx(auVar52,auVar33,auVar19);
      auVar41._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
      auVar41._8_4_ = -auVar38._8_4_;
      auVar41._12_4_ = -auVar38._12_4_;
      auVar41._16_4_ = -auVar38._16_4_;
      auVar41._20_4_ = -auVar38._20_4_;
      auVar41._24_4_ = -auVar38._24_4_;
      auVar41._28_4_ = -auVar38._28_4_;
      auVar38 = vblendvps_avx(auVar38,auVar41,auVar19);
      fVar16 = auVar38._0_4_;
      fVar10 = auVar38._4_4_;
      auVar21._4_4_ = fVar2 * fVar10;
      auVar21._0_4_ = fVar2 * fVar16;
      fVar11 = auVar38._8_4_;
      auVar21._8_4_ = fVar2 * fVar11;
      fVar12 = auVar38._12_4_;
      auVar21._12_4_ = fVar2 * fVar12;
      fVar13 = auVar38._16_4_;
      auVar21._16_4_ = fVar2 * fVar13;
      fVar14 = auVar38._20_4_;
      auVar21._20_4_ = fVar2 * fVar14;
      fVar15 = auVar38._24_4_;
      auVar21._24_4_ = fVar2 * fVar15;
      auVar21._28_4_ = 0x80000000;
      auVar22._4_4_ = fVar3 * fVar10;
      auVar22._0_4_ = fVar3 * fVar16;
      auVar22._8_4_ = fVar3 * fVar11;
      auVar22._12_4_ = fVar3 * fVar12;
      auVar22._16_4_ = fVar3 * fVar13;
      auVar22._20_4_ = fVar3 * fVar14;
      auVar22._24_4_ = fVar3 * fVar15;
      auVar22._28_4_ = auVar19._28_4_;
      auVar23._4_4_ = fVar4 * fVar10;
      auVar23._0_4_ = fVar4 * fVar16;
      auVar23._8_4_ = fVar4 * fVar11;
      auVar23._12_4_ = fVar4 * fVar12;
      auVar23._16_4_ = fVar4 * fVar13;
      auVar23._20_4_ = fVar4 * fVar14;
      auVar23._24_4_ = fVar4 * fVar15;
      auVar23._28_4_ = auVar38._28_4_;
      local_220 = vsubps_avx(auVar21,auVar43);
      local_200 = vsubps_avx(auVar22,auVar18);
      local_1e0 = vsubps_avx(auVar23,auVar42);
      auVar50 = ZEXT3264(local_240);
      local_280 = auVar35;
      auVar42 = vpmovzxwd_avx2(auVar31);
      auVar42 = vpslld_avx2(auVar42,0x1f);
      auVar55._8_4_ = 0x7f800000;
      auVar55._0_8_ = 0x7f8000007f800000;
      auVar55._12_4_ = 0x7f800000;
      auVar55._16_4_ = 0x7f800000;
      auVar55._20_4_ = 0x7f800000;
      auVar55._24_4_ = 0x7f800000;
      auVar55._28_4_ = 0x7f800000;
      auVar56 = ZEXT3264(auVar55);
      auVar42 = vblendvps_avx(auVar55,local_240,auVar42);
      auVar43 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar43 = vminps_avx(auVar42,auVar43);
      auVar18 = vshufpd_avx(auVar43,auVar43,5);
      auVar43 = vminps_avx(auVar43,auVar18);
      auVar38 = vpermpd_avx2(auVar43,0x4e);
      auVar43 = vminps_avx(auVar43,auVar38);
      auVar42 = vcmpps_avx(auVar42,auVar43,0);
      auVar18 = auVar35 & auVar42;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar35 = vandps_avx(auVar42,auVar35);
      }
      auVar31 = auVar32._0_16_;
      uVar25 = vextractps_avx(auVar31,1);
      uVar26 = vmovmskps_avx(auVar35);
      uVar27 = 0;
      for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
        uVar27 = uVar27 + 1;
      }
      auVar57 = ZEXT1664(auVar31);
LAB_0173d756:
      uVar26 = auVar38._28_4_;
      auVar48 = ZEXT436(uVar26);
      auVar35 = auVar58._0_32_;
      auVar42 = auVar68._0_32_;
      auVar32 = auVar67._0_32_;
      auVar65 = auVar66._0_28_;
      auVar62 = auVar64._0_28_;
      auVar49 = ZEXT436(uVar26);
      auVar69 = auVar70._0_28_;
      auVar59 = auVar61._0_28_;
      auVar47 = ZEXT436(auVar43._28_4_);
      uVar29 = (ulong)uVar27;
      local_298 = local_a0[uVar29];
      pGVar6 = (pSVar28->geometries).items[local_298].ptr;
      if ((pGVar6->mask & uVar25) == 0) {
        *(undefined4 *)(local_280 + uVar29 * 4) = 0;
        auVar47 = ZEXT436(auVar43._28_4_);
        auVar49 = ZEXT436(uVar26);
      }
      else {
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar57 = ZEXT464((uint)*(float *)(local_240 + uVar29 * 4));
          (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar29 * 4);
          (ray->Ng).field_0.field_0.x = *(float *)(local_220 + uVar29 * 4);
          (ray->Ng).field_0.field_0.y = *(float *)(local_200 + uVar29 * 4);
          (ray->Ng).field_0.field_0.z = *(float *)(local_1e0 + uVar29 * 4);
          ray->u = 0.0;
          ray->v = 0.0;
          ray->primID = (sphere->primIDs).field_0.i[uVar29];
          ray->geomID = local_298;
          ray->instID[0] = context->user->instID[0];
          ray->instPrimID[0] = context->user->instPrimID[0];
          uVar30 = SUB324(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar,0);
          uVar25 = (ray->super_RayK<1>).mask;
LAB_0173daba:
          auVar17 = vpand_avx(local_190,local_250);
          auVar34._4_4_ = uVar30;
          auVar34._0_4_ = uVar30;
          auVar34._8_4_ = uVar30;
          auVar34._12_4_ = uVar30;
          auVar34._16_4_ = uVar30;
          auVar34._20_4_ = uVar30;
          auVar34._24_4_ = uVar30;
          auVar34._28_4_ = uVar30;
          local_240 = auVar53._0_32_;
          auVar43 = vcmpps_avx(local_240,auVar34,2);
          auVar31 = vpackssdw_avx(auVar43._0_16_,auVar43._16_16_);
          auVar31 = vpand_avx(auVar31,auVar17);
          auVar43 = vpmovzxwd_avx2(auVar31);
          auVar43 = vpslld_avx2(auVar43,0x1f);
          if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0x7f,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar43 >> 0xbf,0) == '\0') &&
              (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar43[0x1f]) {
            return;
          }
          local_280 = vpsrad_avx2(auVar43,0x1f);
          fVar2 = auVar69._0_4_;
          auVar66._0_4_ = auVar59._0_4_ * fVar2;
          fVar3 = auVar69._4_4_;
          auVar66._4_4_ = auVar59._4_4_ * fVar3;
          fVar4 = auVar69._8_4_;
          auVar66._8_4_ = auVar59._8_4_ * fVar4;
          fVar16 = auVar69._12_4_;
          auVar66._12_4_ = auVar59._12_4_ * fVar16;
          fVar10 = auVar69._16_4_;
          auVar66._16_4_ = auVar59._16_4_ * fVar10;
          fVar11 = auVar69._20_4_;
          auVar66._20_4_ = auVar59._20_4_ * fVar11;
          fVar12 = auVar69._24_4_;
          auVar66._24_4_ = auVar59._24_4_ * fVar12;
          auVar66._28_36_ = auVar47;
          auVar61._4_4_ = auVar62._4_4_ * fVar3;
          auVar61._0_4_ = auVar62._0_4_ * fVar2;
          auVar61._8_4_ = auVar62._8_4_ * fVar4;
          auVar61._12_4_ = auVar62._12_4_ * fVar16;
          auVar61._16_4_ = auVar62._16_4_ * fVar10;
          auVar61._20_4_ = auVar62._20_4_ * fVar11;
          auVar61._24_4_ = auVar62._24_4_ * fVar12;
          auVar61._28_36_ = auVar49;
          auVar64._4_4_ = auVar65._4_4_ * fVar3;
          auVar64._0_4_ = auVar65._0_4_ * fVar2;
          auVar64._8_4_ = auVar65._8_4_ * fVar4;
          auVar64._12_4_ = auVar65._12_4_ * fVar16;
          auVar64._16_4_ = auVar65._16_4_ * fVar10;
          auVar64._20_4_ = auVar65._20_4_ * fVar11;
          auVar64._24_4_ = auVar65._24_4_ * fVar12;
          auVar64._28_36_ = auVar50._28_36_;
          local_220 = vsubps_avx(auVar66._0_32_,auVar32);
          local_200 = vsubps_avx(auVar61._0_32_,auVar42);
          local_1e0 = vsubps_avx(auVar64._0_32_,auVar35);
          pSVar28 = context->scene;
          auVar35 = vblendvps_avx(auVar56._0_32_,local_240,auVar43);
          auVar32 = vshufps_avx(auVar35,auVar35,0xb1);
          auVar32 = vminps_avx(auVar35,auVar32);
          auVar42 = vshufpd_avx(auVar32,auVar32,5);
          auVar32 = vminps_avx(auVar32,auVar42);
          auVar42 = vpermpd_avx2(auVar32,0x4e);
          auVar32 = vminps_avx(auVar32,auVar42);
          auVar35 = vcmpps_avx(auVar35,auVar32,0);
          auVar17 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
          auVar31 = vpand_avx(auVar17,auVar31);
          auVar35 = vpmovzxwd_avx2(auVar31);
          auVar35 = vpslld_avx2(auVar35,0x1f);
          if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar35 >> 0x7f,0) == '\0') &&
                (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar35 >> 0xbf,0) == '\0') &&
              (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar35[0x1f]) {
            auVar35 = local_280;
          }
          uVar26 = vmovmskps_avx(auVar35);
          uVar27 = 0;
          for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
            uVar27 = uVar27 + 1;
          }
          do {
            uVar29 = (ulong)uVar27;
            local_298 = local_a0[uVar29];
            pGVar6 = (pSVar28->geometries).items[local_298].ptr;
            if ((pGVar6->mask & uVar25) == 0) {
              *(undefined4 *)(local_280 + uVar29 * 4) = 0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar29 * 4);
                (ray->Ng).field_0.field_0.x = *(float *)(local_220 + uVar29 * 4);
                (ray->Ng).field_0.field_0.y = *(float *)(local_200 + uVar29 * 4);
                (ray->Ng).field_0.field_0.z = *(float *)(local_1e0 + uVar29 * 4);
                ray->u = 0.0;
                ray->v = 0.0;
                ray->primID = (sphere->primIDs).field_0.i[uVar29];
                ray->geomID = local_298;
                ray->instID[0] = context->user->instID[0];
                ray->instPrimID[0] = context->user->instPrimID[0];
                return;
              }
              local_250._0_8_ = pSVar28;
              local_2e4 = auVar57._0_4_;
              local_1c0 = auVar53._0_32_;
              local_2b0 = *(float *)(local_220 + uVar29 * 4);
              local_2ac = *(undefined4 *)(local_200 + uVar29 * 4);
              local_2a8 = *(undefined4 *)(local_1e0 + uVar29 * 4);
              local_2a4 = 0;
              local_29c = (sphere->primIDs).field_0.i[uVar29];
              local_294 = context->user->instID[0];
              local_290 = context->user->instPrimID[0];
              (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar29 * 4);
              local_2e8 = -1;
              local_2e0.valid = &local_2e8;
              local_2e0.geometryUserPtr = pGVar6->userPtr;
              local_2e0.context = context->user;
              local_2e0.ray = (RTCRayN *)ray;
              local_2e0.hit = (RTCHitN *)&local_2b0;
              local_2e0.N = 1;
              if ((pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar6->intersectionFilterN)(&local_2e0), *local_2e0.valid != 0)) {
                p_Var9 = context->args->filter;
                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                      RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))
                    && ((*p_Var9)(&local_2e0), *local_2e0.valid == 0)))) goto LAB_0173dd95;
                (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.x =
                     *(float *)local_2e0.hit;
                (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.y =
                     *(float *)(local_2e0.hit + 4);
                (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.z =
                     *(float *)(local_2e0.hit + 8);
                *(float *)((long)local_2e0.ray + 0x3c) = *(float *)(local_2e0.hit + 0xc);
                *(float *)((long)local_2e0.ray + 0x40) = *(float *)(local_2e0.hit + 0x10);
                *(float *)((long)local_2e0.ray + 0x44) = *(float *)(local_2e0.hit + 0x14);
                *(float *)((long)local_2e0.ray + 0x48) = *(float *)(local_2e0.hit + 0x18);
                *(float *)((long)local_2e0.ray + 0x4c) = *(float *)(local_2e0.hit + 0x1c);
                *(float *)((long)local_2e0.ray + 0x50) = *(float *)(local_2e0.hit + 0x20);
              }
              else {
LAB_0173dd95:
                (ray->super_RayK<1>).tfar = local_2e4;
              }
              auVar56 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              pSVar28 = (Scene *)local_250._0_8_;
              *(undefined4 *)(local_280 + uVar29 * 4) = 0;
              fVar2 = (ray->super_RayK<1>).tfar;
              auVar36._4_4_ = fVar2;
              auVar36._0_4_ = fVar2;
              auVar36._8_4_ = fVar2;
              auVar36._12_4_ = fVar2;
              auVar36._16_4_ = fVar2;
              auVar36._20_4_ = fVar2;
              auVar36._24_4_ = fVar2;
              auVar36._28_4_ = fVar2;
              auVar53 = ZEXT3264(local_1c0);
              auVar35 = vcmpps_avx(local_1c0,auVar36,2);
              local_280 = vandps_avx(auVar35,local_280);
              uVar25 = (ray->super_RayK<1>).mask;
              auVar57 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
            }
            if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_280 >> 0x7f,0) == '\0') &&
                  (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_280 >> 0xbf,0) == '\0') &&
                (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_280[0x1f]) {
              return;
            }
            auVar35 = vblendvps_avx(auVar56._0_32_,auVar53._0_32_,local_280);
            auVar32 = vshufps_avx(auVar35,auVar35,0xb1);
            auVar32 = vminps_avx(auVar35,auVar32);
            auVar42 = vshufpd_avx(auVar32,auVar32,5);
            auVar32 = vminps_avx(auVar32,auVar42);
            auVar42 = vpermpd_avx2(auVar32,0x4e);
            auVar32 = vminps_avx(auVar32,auVar42);
            auVar32 = vcmpps_avx(auVar35,auVar32,0);
            auVar42 = local_280 & auVar32;
            auVar35 = local_280;
            if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0x7f,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar42 >> 0xbf,0) != '\0') ||
                (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar42[0x1f] < '\0') {
              auVar35 = vandps_avx(auVar32,local_280);
            }
            uVar26 = vmovmskps_avx(auVar35);
            uVar27 = 0;
            for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
              uVar27 = uVar27 + 1;
            }
          } while( true );
        }
        local_80 = auVar50._0_32_;
        local_180 = auVar70._0_32_;
        local_160 = auVar35;
        local_140 = auVar42;
        local_120 = auVar32;
        local_100 = auVar66._0_32_;
        local_e0 = auVar64._0_32_;
        local_c0 = auVar61._0_32_;
        local_2e4 = auVar57._0_4_;
        local_258 = pSVar28;
        local_1c0 = auVar53._0_32_;
        auVar47 = (undefined1  [36])0x0;
        local_2b0 = *(float *)(local_220 + uVar29 * 4);
        local_2ac = *(undefined4 *)(local_200 + uVar29 * 4);
        local_2a8 = *(undefined4 *)(local_1e0 + uVar29 * 4);
        local_2a4 = 0;
        local_29c = (sphere->primIDs).field_0.i[uVar29];
        local_294 = context->user->instID[0];
        local_290 = context->user->instPrimID[0];
        (ray->super_RayK<1>).tfar = *(float *)(local_240 + uVar29 * 4);
        local_2e8 = -1;
        local_2e0.valid = &local_2e8;
        local_2e0.geometryUserPtr = pGVar6->userPtr;
        local_2e0.context = context->user;
        local_2e0.ray = (RTCRayN *)ray;
        local_2e0.hit = (RTCHitN *)&local_2b0;
        local_2e0.N = 1;
        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0173d8a7:
          p_Var9 = context->args->filter;
          if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
               RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
            auVar47 = (undefined1  [36])0x0;
            auVar48 = (undefined1  [36])0x0;
            (*p_Var9)(&local_2e0);
            if (*local_2e0.valid == 0) goto LAB_0173d990;
          }
          (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.x = *(float *)local_2e0.hit;
          (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.y =
               *(float *)(local_2e0.hit + 4);
          (((Vec3f *)((long)local_2e0.ray + 0x30))->field_0).field_0.z =
               *(float *)(local_2e0.hit + 8);
          *(float *)((long)local_2e0.ray + 0x3c) = *(float *)(local_2e0.hit + 0xc);
          *(float *)((long)local_2e0.ray + 0x40) = *(float *)(local_2e0.hit + 0x10);
          *(float *)((long)local_2e0.ray + 0x44) = *(float *)(local_2e0.hit + 0x14);
          *(float *)((long)local_2e0.ray + 0x48) = *(float *)(local_2e0.hit + 0x18);
          *(float *)((long)local_2e0.ray + 0x4c) = *(float *)(local_2e0.hit + 0x1c);
          *(float *)((long)local_2e0.ray + 0x50) = *(float *)(local_2e0.hit + 0x20);
        }
        else {
          auVar47 = (undefined1  [36])0x0;
          auVar48 = SUB6036((undefined1  [60])0x0,0x18);
          (*pGVar6->intersectionFilterN)(&local_2e0);
          if (*local_2e0.valid != 0) goto LAB_0173d8a7;
LAB_0173d990:
          (ray->super_RayK<1>).tfar = local_2e4;
        }
        pSVar28 = local_258;
        auVar53 = ZEXT3264(local_1c0);
        auVar56 = ZEXT3264(CONCAT428(0x7f800000,
                                     CONCAT424(0x7f800000,
                                               CONCAT420(0x7f800000,
                                                         CONCAT416(0x7f800000,
                                                                   CONCAT412(0x7f800000,
                                                                             CONCAT48(0x7f800000,
                                                                                                                                                                            
                                                  0x7f8000007f800000)))))));
        auVar61 = ZEXT3264(local_c0);
        auVar64 = ZEXT3264(local_e0);
        auVar66 = ZEXT3264(local_100);
        auVar67 = ZEXT3264(local_120);
        auVar68 = ZEXT3264(local_140);
        auVar58 = ZEXT3264(local_160);
        auVar70 = ZEXT3264(local_180);
        *(undefined4 *)(local_280 + uVar29 * 4) = 0;
        fVar2 = (ray->super_RayK<1>).tfar;
        auVar42._4_4_ = fVar2;
        auVar42._0_4_ = fVar2;
        auVar42._8_4_ = fVar2;
        auVar42._12_4_ = fVar2;
        auVar42._16_4_ = fVar2;
        auVar42._20_4_ = fVar2;
        auVar42._24_4_ = fVar2;
        auVar42._28_4_ = fVar2;
        auVar50 = ZEXT3264(local_80);
        auVar35 = vcmpps_avx(local_80,auVar42,2);
        local_280 = vandps_avx(auVar35,local_280);
        auVar37 = ZEXT3264(*(undefined1 (*) [32])&(ray->super_RayK<1>).tfar);
        uVar25 = (ray->super_RayK<1>).mask;
        auVar57 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar49 = auVar48;
      }
      uVar30 = auVar37._0_4_;
      auVar35 = auVar58._0_32_;
      auVar42 = auVar68._0_32_;
      auVar32 = auVar67._0_32_;
      auVar65 = auVar66._0_28_;
      auVar62 = auVar64._0_28_;
      auVar69 = auVar70._0_28_;
      auVar59 = auVar61._0_28_;
      if ((((((((local_280 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_280 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_280 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_280 >> 0x7f,0) == '\0') &&
            (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_280 >> 0xbf,0) == '\0') &&
          (local_280 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_280[0x1f]) goto LAB_0173daba;
      auVar35 = vblendvps_avx(auVar56._0_32_,auVar50._0_32_,local_280);
      auVar32 = vshufps_avx(auVar35,auVar35,0xb1);
      auVar32 = vminps_avx(auVar35,auVar32);
      auVar42 = vshufpd_avx(auVar32,auVar32,5);
      auVar32 = vminps_avx(auVar32,auVar42);
      auVar38 = vpermpd_avx2(auVar32,0x4e);
      auVar43 = vminps_avx(auVar32,auVar38);
      auVar32 = vcmpps_avx(auVar35,auVar43,0);
      auVar42 = local_280 & auVar32;
      auVar35 = local_280;
      if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar42 >> 0x7f,0) != '\0') ||
            (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar42 >> 0xbf,0) != '\0') ||
          (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar42[0x1f] < '\0') {
        auVar35 = vandps_avx(auVar32,local_280);
      }
      uVar26 = vmovmskps_avx(auVar35);
      uVar27 = 0;
      for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x80000000) {
        uVar27 = uVar27 + 1;
      }
      goto LAB_0173d756;
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(const Precalculations& pre,
                                          RayHit& ray,
                                          RayQueryContext* context,
                                          const Primitive& sphere)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(sphere.geomID());
        Vec4vf<M> v0; sphere.gather(v0, geom);
        const vbool<M> valid = sphere.valid();
        SphereIntersector1<M>::intersect(
          valid, ray, context, geom, pre, v0, Intersect1EpilogM<M, filter>(ray, context, sphere.geomID(), sphere.primID()));
      }